

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O1

int idamax(int n,double *dx,int incx)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  uint uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = 0;
  if (0 < incx && 0 < n) {
    uVar2 = 1;
    iVar1 = 1;
    if (n != 1) {
      if (incx == 1) {
        if (1 < n) {
          dVar7 = ABS(*dx);
          uVar3 = 1;
          do {
            dVar8 = ABS(dx[uVar3]);
            uVar3 = uVar3 + 1;
            if (dVar7 < dVar8) {
              uVar2 = uVar3 & 0xffffffff;
            }
            iVar1 = (int)uVar2;
            if (dVar8 <= dVar7) {
              dVar8 = dVar7;
            }
            dVar7 = dVar8;
          } while ((uint)n != uVar3);
        }
      }
      else if (1 < n) {
        dVar7 = ABS(*dx);
        pdVar4 = dx + (uint)incx;
        uVar5 = 2;
        do {
          dVar8 = ABS(*pdVar4);
          if (dVar7 < dVar8) {
            uVar2 = (ulong)uVar5;
          }
          iVar1 = (int)uVar2;
          if (dVar8 <= dVar7) {
            dVar8 = dVar7;
          }
          dVar7 = dVar8;
          pdVar4 = pdVar4 + (uint)incx;
          bVar6 = uVar5 != n;
          uVar5 = uVar5 + 1;
        } while (bVar6);
      }
    }
  }
  return iVar1;
}

Assistant:

int idamax ( int n, double dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IDAMAX finds the index of the vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int IDAMAX, the index of the element of maximum
//    absolute value.
//
{
  double dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}